

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

void __thiscall
miniros::MasterLink::setParamImpl<double>
          (MasterLink *this,string *key,vector<double,_std::allocator<double>_> *vec)

{
  const_reference rhs;
  XmlRpcValue *this_00;
  size_t i;
  ulong __n;
  RpcValue xml_vec;
  XmlRpcValue local_40;
  
  local_40._type = TypeInvalid;
  local_40._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertArray(&local_40,(int)((ulong)(*(long *)(vec + 8) - *(long *)vec) >> 3))
  ;
  for (__n = 0; __n < (ulong)(*(long *)(vec + 8) - *(long *)vec >> 3); __n = __n + 1) {
    rhs = std::vector<double,_std::allocator<double>_>::at(vec,__n);
    this_00 = XmlRpc::XmlRpcValue::operator[](&local_40,(int)__n);
    XmlRpc::XmlRpcValue::operator=(this_00,rhs);
  }
  set(this,key,&local_40);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_40);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::vector<T>& vec)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertArray turns it
  // into an array type with the given size
  RpcValue xml_vec;
  xml_vec.setSize(vec.size());

  // Copy the contents into the XmlRpcValue
  for (size_t i = 0; i < vec.size(); i++) {
    xml_vec[i] = vec.at(i);
  }

  this->set(key, xml_vec);
}